

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

int unshield_file_directory(Unshield *unshield,int index)

{
  uint32_t uVar1;
  FileDescriptor *pFVar2;
  
  pFVar2 = unshield_get_file_descriptor((Unshield *)unshield->header_list,index);
  if (pFVar2 == (FileDescriptor *)0x0) {
    uVar1 = 0xffffffff;
  }
  else {
    uVar1 = pFVar2->directory_index;
  }
  return uVar1;
}

Assistant:

int unshield_file_directory(Unshield* unshield, int index)/*{{{*/
{
  FileDescriptor* fd = unshield_get_file_descriptor(unshield, index);
  if (fd)
  {
    return fd->directory_index;
  }
  else
    return -1;
}